

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEdit.cpp
# Opt level: O3

void __thiscall GraphEdit::GraphEdit(GraphEdit *this,GraphModel *model,QWidget *parent)

{
  undefined8 uVar1;
  undefined8 uVar2;
  void **ppvVar3;
  undefined4 *puVar4;
  code *local_50;
  undefined8 local_48;
  QObject local_40 [8];
  QObject local_38 [8];
  code *local_30;
  ImplFn local_28;
  
  QAbstractScrollArea::QAbstractScrollArea(&this->super_QAbstractScrollArea,parent);
  *(undefined ***)this = &PTR_metaObject_001fd1e0;
  *(undefined ***)&this->field_0x10 = &PTR__GraphEdit_001fd3b8;
  this->mModel = model;
  this->mMode = WaveformView;
  (this->mPlotRect).x1 = 0;
  (this->mPlotRect).y1 = 0;
  (this->mPlotRect).x2 = -1;
  (this->mPlotRect).y2 = -1;
  this->mBarMode = false;
  this->mLines = true;
  (this->mMouseOver).super__Optional_base<QPoint,_true,_true>._M_payload.
  super__Optional_payload_base<QPoint>._M_engaged = false;
  (this->mLastMouseCoords).xp = 0;
  (this->mLastMouseCoords).yp = 0;
  (this->mBackgroundColor).cspec = Invalid;
  this->mMinValue = 0;
  this->mMaxValue = 0;
  this->mCellWidth = 0;
  this->mCellHeight = 0;
  this->mAlternateInterval = 0;
  (this->mBackgroundColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->mBackgroundColor).ct + 2) = 0;
  (this->mAlternateColor).cspec = Invalid;
  (this->mAlternateColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->mAlternateColor).ct + 2) = 0;
  (this->mLineColor).cspec = Invalid;
  (this->mLineColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->mLineColor).ct + 2) = 0;
  (this->mSampleColor).cspec = Invalid;
  (this->mSampleColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->mSampleColor).ct + 2) = 0;
  ppvVar3 = (void **)QAbstractScrollArea::viewport();
  QWidget::setAttribute((WidgetAttribute)ppvVar3,true);
  uVar1 = *(undefined8 *)((long)ppvVar3[4] + 0x1c);
  uVar2 = *(undefined8 *)((long)ppvVar3[4] + 0x14);
  (this->mPlotRect).x1 = 8;
  (this->mPlotRect).y1 = 8;
  (this->mPlotRect).x2 = ((int)uVar1 - (int)uVar2) + -8;
  (this->mPlotRect).y2 = ((int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20)) + -8;
  local_50 = GraphModel::dataChanged;
  local_48 = 0;
  local_30 = QWidget::update;
  local_28 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QSlotObject<void_(QWidget::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = QWidget::update;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)model,(QObject *)&local_50,ppvVar3,(QSlotObjectBase *)&local_30,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  local_50 = GraphModel::countChanged;
  local_48 = 0;
  puVar4 = (undefined4 *)operator_new(0x18);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/widgets/GraphEdit.cpp:96:9),_1,_QtPrivate::List<int>,_void>
       ::impl;
  *(GraphEdit **)(puVar4 + 4) = this;
  QObject::connectImpl
            (local_40,(void **)model,(QObject *)&local_50,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  calculateAxis(this);
  setViewModeImpl(this,this->mMode);
  return;
}

Assistant:

GraphEdit::GraphEdit(GraphModel &model, QWidget *parent) :
    QAbstractScrollArea(parent),
    mModel(model),
    mMode(GraphEdit::WaveformView),
    mBarMode(false),
    mLines(true),
    mMinValue(0),
    mMaxValue(0),
    mCellWidth(0),
    mCellHeight(0),
    mAlternateInterval(0),
    mMouseOver()
{
    auto _viewport = viewport();
    _viewport->setMouseTracking(true);
    mPlotRect = _viewport->rect();
    mPlotRect.adjust(TU::PADDING_X, TU::PADDING_Y, -TU::PADDING_X, -TU::PADDING_Y);

    connect(&model, &GraphModel::dataChanged, _viewport, qOverload<>(&QWidget::update));
    connect(&model, &GraphModel::countChanged, this,
        [this](int count) {
            Q_UNUSED(count)
            calculateCellWidth();
            viewport()->update();
        });

    calculateAxis();
    setViewModeImpl(mMode);
}